

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

pair<BigNum,_BigNum> * pairDivMod(pair<BigNum,_BigNum> *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  bool local_3a2;
  BigNum local_378;
  BigNum local_358;
  BigNum local_338;
  BigNum local_318;
  BigNum local_2f8;
  int local_2d4;
  undefined1 local_2d0 [4];
  int j;
  BigNum local_2b0;
  BigNum local_290;
  BigNum local_270;
  undefined1 local_250 [8];
  BigNum current;
  BigNum local_210;
  int local_1ec;
  undefined1 local_1e8 [4];
  int midresult;
  BigNum local_1c8;
  byte local_1a2;
  byte local_1a1;
  BigNum local_1a0;
  BigNum local_180;
  byte local_15a;
  byte local_159;
  BigNum local_158;
  BigNum local_138;
  BigNum local_118;
  BigNum local_f8;
  BigNum local_d8;
  undefined4 local_b4;
  BigNum local_b0;
  BigNum local_90;
  int local_70;
  int i;
  undefined1 local_60 [8];
  BigNum result;
  BigNum z;
  BigNum *b_local;
  BigNum *a_local;
  
  BigNum::BigNum((BigNum *)&result.length,0);
  BigNum::BigNum((BigNum *)local_60,0);
  local_70 = a->length;
  do {
    do {
      local_70 = local_70 + -1;
      if (local_70 < 0) {
        std::pair<BigNum,_BigNum>::pair<BigNum_&,_BigNum_&,_true>
                  (__return_storage_ptr__,(BigNum *)local_60,(BigNum *)&result.length);
LAB_0010494e:
        local_b4 = 1;
        BigNum::~BigNum((BigNum *)local_60);
        BigNum::~BigNum((BigNum *)&result.length);
        return __return_storage_ptr__;
      }
    } while (a->length <= local_70);
    BigNum::BigNum(&local_90,a);
    BigNum::BigNum(&local_b0,b);
    bVar1 = operator<(&local_90,&local_b0);
    BigNum::~BigNum(&local_b0);
    BigNum::~BigNum(&local_90);
    if (bVar1) {
      std::pair<BigNum,_BigNum>::pair<BigNum_&,_BigNum_&,_true>
                (__return_storage_ptr__,(BigNum *)local_60,a);
      goto LAB_0010494e;
    }
    BigNum::BigNum(&local_118,(BigNum *)&result.length);
    operator*(&local_f8,&local_118,10);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&a->digits,(long)local_70);
    operator+(&local_d8,&local_f8,*pvVar3);
    BigNum::operator=((BigNum *)&result.length,&local_d8);
    BigNum::~BigNum(&local_d8);
    BigNum::~BigNum(&local_f8);
    BigNum::~BigNum(&local_118);
    local_159 = 0;
    local_15a = 0;
    local_1a1 = 0;
    local_1a2 = 0;
    local_3a2 = true;
    if (b->length <=
        (int)z.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage) {
      BigNum::BigNum(&local_158,(BigNum *)&result.length);
      local_159 = 1;
      abs((int)&local_138);
      local_15a = 1;
      BigNum::BigNum(&local_1a0,b);
      local_1a1 = 1;
      abs((int)&local_180);
      local_1a2 = 1;
      local_3a2 = operator<(&local_138,&local_180);
    }
    if ((local_1a2 & 1) != 0) {
      BigNum::~BigNum(&local_180);
    }
    if ((local_1a1 & 1) != 0) {
      BigNum::~BigNum(&local_1a0);
    }
    if ((local_15a & 1) != 0) {
      BigNum::~BigNum(&local_138);
    }
    if ((local_159 & 1) != 0) {
      BigNum::~BigNum(&local_158);
    }
    if (local_3a2 == false) {
      BigNum::BigNum(&local_210,(BigNum *)&result.length);
      BigNum::BigNum((BigNum *)&current.length,b);
      iVar2 = search(&local_210,(BigNum *)&current.length);
      BigNum::~BigNum((BigNum *)&current.length);
      BigNum::~BigNum(&local_210);
      local_1ec = iVar2;
      BigNum::BigNum(&local_270,b);
      operator*((BigNum *)local_250,&local_270,local_1ec);
      BigNum::~BigNum(&local_270);
      BigNum::BigNum(&local_2b0,(BigNum *)&result.length);
      BigNum::BigNum((BigNum *)local_2d0,(BigNum *)local_250);
      operator-(&local_290,&local_2b0,(BigNum *)local_2d0);
      BigNum::operator=((BigNum *)&result.length,&local_290);
      BigNum::~BigNum(&local_290);
      BigNum::~BigNum((BigNum *)local_2d0);
      BigNum::~BigNum(&local_2b0);
      for (local_2d4 = 0; local_2d4 < local_70; local_2d4 = local_2d4 + 1) {
        BigNum::BigNum(&local_318,(BigNum *)local_250);
        operator*(&local_2f8,&local_318,10);
        BigNum::operator=((BigNum *)local_250,&local_2f8);
        BigNum::~BigNum(&local_2f8);
        BigNum::~BigNum(&local_318);
      }
      BigNum::BigNum(&local_378,(BigNum *)local_60);
      operator*(&local_358,&local_378,10);
      operator+(&local_338,&local_358,local_1ec);
      BigNum::operator=((BigNum *)local_60,&local_338);
      BigNum::~BigNum(&local_338);
      BigNum::~BigNum(&local_358);
      BigNum::~BigNum(&local_378);
      BigNum::~BigNum((BigNum *)local_250);
    }
    else {
      BigNum::BigNum((BigNum *)local_1e8,(BigNum *)local_60);
      operator*(&local_1c8,(BigNum *)local_1e8,10);
      BigNum::operator=((BigNum *)local_60,&local_1c8);
      BigNum::~BigNum(&local_1c8);
      BigNum::~BigNum((BigNum *)local_1e8);
    }
  } while( true );
}

Assistant:

std::pair<BigNum, BigNum> pairDivMod(BigNum a, BigNum b){
    BigNum z = BigNum(0);
    BigNum result = BigNum(0);
    for (int i = a.length - 1; i >= 0; i--) {
        if(i >= a.length)
            continue;
        if(a < b)
            return  {result, a};
        z = z * 10 + a.digits[i];
        if (z.length < b.length || abs(z) < abs(b)) {
            result = result * 10;
            continue;
        }
        int midresult = search(z, b);
        BigNum current = b * midresult;
        z = z - current;
        for (int j = 0; j < i; j++){
            current = current * 10;
        }
        result = result * 10 + midresult;
    }
    return  {result, z};
}